

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::tryInt(TokenStream *this,Token *token,ParseLocation *loc)

{
  bool bVar1;
  int i;
  string str;
  string local_88;
  Token local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  bVar1 = decDigits(this,&local_88);
  if (bVar1) {
    i = atoi(local_88._M_dataplus._M_p);
    Token::Token(&local_68,i,loc);
    Token::operator=(token,&local_68);
    Token::~Token(&local_68);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return bVar1;
}

Assistant:

bool TokenStream::tryInt(Token& token, const ParseLocation& loc) {
    std::string str;
    if (decDigits(str)) {
      token = Token(atoi(str.c_str()),loc);
      return true;
    }
    return false;
  }